

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_settings_frame(nghttp2_session *session)

{
  nghttp2_settings_entry nVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uStack_2c;
  nghttp2_settings_entry min_header_size_entry;
  size_t i;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_session *session_local;
  
  if ((session->iframe).max_niv != 0) {
    nVar1 = (session->iframe).iv[(session->iframe).max_niv - 1];
    uStack_2c = nVar1.value;
    if (uStack_2c != 0xffffffff) {
      min_header_size_entry.settings_id = 0;
      min_header_size_entry.value = 0;
      for (; ((ulong)min_header_size_entry < (session->iframe).niv &&
             ((session->iframe).iv[(long)min_header_size_entry].settings_id != 1));
          min_header_size_entry = (nghttp2_settings_entry)((long)min_header_size_entry + 1)) {
      }
      if ((session->iframe).niv <= (ulong)min_header_size_entry) {
        __assert_fail("i < iframe->niv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1386,"int session_process_settings_frame(nghttp2_session *)");
      }
      if (uStack_2c != (session->iframe).iv[(long)min_header_size_entry].value) {
        sVar2 = (session->iframe).niv;
        (session->iframe).niv = sVar2 + 1;
        (session->iframe).iv[sVar2] = (session->iframe).iv[(long)min_header_size_entry];
        (session->iframe).iv[(long)min_header_size_entry] = nVar1;
      }
    }
  }
  nghttp2_frame_unpack_settings_payload
            ((nghttp2_settings *)&session->iframe,(session->iframe).iv,(session->iframe).niv);
  (session->iframe).iv = (nghttp2_settings_entry *)0x0;
  (session->iframe).niv = 0;
  (session->iframe).max_niv = 0;
  iVar3 = nghttp2_session_on_settings_received(session,&(session->iframe).frame,0);
  return iVar3;
}

Assistant:

static int session_process_settings_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;
  size_t i;
  nghttp2_settings_entry min_header_size_entry;

  if (iframe->max_niv) {
    min_header_size_entry = iframe->iv[iframe->max_niv - 1];

    if (min_header_size_entry.value < UINT32_MAX) {
      /* If we have less value, then we must have
         SETTINGS_HEADER_TABLE_SIZE in i < iframe->niv */
      for (i = 0; i < iframe->niv; ++i) {
        if (iframe->iv[i].settings_id == NGHTTP2_SETTINGS_HEADER_TABLE_SIZE) {
          break;
        }
      }

      assert(i < iframe->niv);

      if (min_header_size_entry.value != iframe->iv[i].value) {
        iframe->iv[iframe->niv++] = iframe->iv[i];
        iframe->iv[i] = min_header_size_entry;
      }
    }
  }

  nghttp2_frame_unpack_settings_payload(&frame->settings, iframe->iv,
                                        iframe->niv);

  iframe->iv = NULL;
  iframe->niv = 0;
  iframe->max_niv = 0;

  return nghttp2_session_on_settings_received(session, frame, 0 /* ACK */);
}